

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O2

SVectorBase<double> * __thiscall
soplex::SVectorBase<double>::operator=
          (SVectorBase<double> *this,
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          *sv)

{
  type_conflict5 tVar1;
  Nonzero<double> *this_00;
  Nonzero<double> *pNVar2;
  int iVar3;
  int iVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *vec;
  bool bVar5;
  double local_38;
  
  if ((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
       *)this != sv) {
    iVar3 = sv->memused;
    vec = sv->m_elem;
    iVar4 = 0;
    this_00 = this->m_elem;
    while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
      local_38 = 0.0;
      tVar1 = boost::multiprecision::operator!=(&vec->val,&local_38);
      pNVar2 = this_00;
      if (tVar1) {
        pNVar2 = this_00 + 1;
        Nonzero<double>::operator=(this_00,vec);
        iVar4 = iVar4 + 1;
      }
      vec = vec + 1;
      this_00 = pNVar2;
    }
    this->memused = iVar4;
  }
  return this;
}

Assistant:

SVectorBase<R>& operator=(const SVectorBase<S>& sv)
   {
      if(this != (const SVectorBase<R>*)(&sv))
      {
         assert(max() >= sv.size());

         int i = sv.size();
         int nnz = 0;
         Nonzero<R>* e = m_elem;
         const Nonzero<S>* s = sv.m_elem;

         while(i--)
         {
            assert(e != nullptr);

            if(s->val != 0.0)
            {
               *e++ = *s;
               ++nnz;
            }

            ++s;
         }

         set_size(nnz);
      }

      return *this;
   }